

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall pugi::xpath_query::~xpath_query(xpath_query *this)

{
  void *pvVar1;
  long *plVar2;
  xpath_memory_block *next;
  long *plVar3;
  
  pvVar1 = this->_impl;
  if (pvVar1 != (void *)0x0) {
    plVar3 = *(long **)((long)pvVar1 + 8);
    while (plVar2 = (long *)*plVar3, plVar2 != (long *)0x0) {
      (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
      )(plVar3);
      plVar3 = plVar2;
    }
    (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              (pvVar1);
  }
  return;
}

Assistant:

PUGI_IMPL_FN xpath_query::~xpath_query()
	{
		if (_impl)
			impl::xpath_query_impl::destroy(static_cast<impl::xpath_query_impl*>(_impl));
	}